

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlTextConcat(xmlNodePtr node,xmlChar *content,int len)

{
  xmlDictPtr dict;
  int iVar1;
  xmlChar *pxVar2;
  
  iVar1 = -1;
  if (((node != (xmlNodePtr)0x0) && (node->type < XML_DOCUMENT_NODE)) &&
     ((0x198U >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    if (((_xmlAttr **)node->content == &node->properties) ||
       (((node->doc != (_xmlDoc *)0x0 && (dict = node->doc->dict, dict != (xmlDictPtr)0x0)) &&
        (iVar1 = xmlDictOwns(dict,node->content), iVar1 != 0)))) {
      pxVar2 = xmlStrncatNew(node->content,content,len);
    }
    else {
      pxVar2 = xmlStrncat(node->content,content,len);
    }
    node->content = pxVar2;
    node->properties = (_xmlAttr *)0x0;
    iVar1 = -(uint)(pxVar2 == (xmlChar *)0x0);
  }
  return iVar1;
}

Assistant:

int
xmlTextConcat(xmlNodePtr node, const xmlChar *content, int len) {
    if (node == NULL) return(-1);

    if ((node->type != XML_TEXT_NODE) &&
        (node->type != XML_CDATA_SECTION_NODE) &&
	(node->type != XML_COMMENT_NODE) &&
	(node->type != XML_PI_NODE)) {
#ifdef DEBUG_TREE
	xmlGenericError(xmlGenericErrorContext,
		"xmlTextConcat: node is not text nor CDATA\n");
#endif
        return(-1);
    }
    /* need to check if content is currently in the dictionary */
    if ((node->content == (xmlChar *) &(node->properties)) ||
        ((node->doc != NULL) && (node->doc->dict != NULL) &&
		xmlDictOwns(node->doc->dict, node->content))) {
	node->content = xmlStrncatNew(node->content, content, len);
    } else {
        node->content = xmlStrncat(node->content, content, len);
    }
    node->properties = NULL;
    if (node->content == NULL)
        return(-1);
    return(0);
}